

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O2

gnode_t * gnode_variable_create
                    (gtoken_s token,char *identifier,char *annotation_type,gnode_t *expr,
                    gnode_t *decl,gnode_variable_decl_t *vdecl)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x78);
  pgVar1->tag = NODE_VARIABLE;
  (pgVar1->token).type = token.type;
  (pgVar1->token).lineno = token.lineno;
  (pgVar1->token).colno = token.colno;
  (pgVar1->token).position = token.position;
  (pgVar1->token).bytes = token.bytes;
  (pgVar1->token).length = token.length;
  (pgVar1->token).fileid = token.fileid;
  (pgVar1->token).builtin = token.builtin;
  (pgVar1->token).value = token.value;
  pgVar1->decl = decl;
  *(char **)&pgVar1[1].block_length = identifier;
  *(char **)&pgVar1[1].token = annotation_type;
  *(gnode_t **)&pgVar1[1].token.colno = expr;
  *(gnode_variable_decl_t **)&pgVar1[1].token.fileid = vdecl;
  *(undefined1 *)((long)&pgVar1[1].token.length + 3) = 0;
  return pgVar1;
}

Assistant:

gnode_t *gnode_variable_create (gtoken_s token, const char *identifier, const char *annotation_type, gnode_t *expr, gnode_t *decl, gnode_variable_decl_t *vdecl) {
    gnode_var_t *node = (gnode_var_t *)mem_alloc(NULL, sizeof(gnode_var_t));

    SETBASE(node, NODE_VARIABLE, token);
    SETDECL(node, decl);
    node->identifier = identifier;
    node->annotation_type = annotation_type;
    node->expr = expr;
    node->vdecl = vdecl;
    node->iscomputed = false;
    return (gnode_t *)node;
}